

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O3

int docall(lua_State *L,int narg,int clear)

{
  int iVar1;
  int iVar2;
  
  iVar1 = lua_gettop(L);
  iVar1 = iVar1 - narg;
  lua_pushcclosure(L,traceback,0);
  lua_insert(L,iVar1);
  signal(2,laction);
  iVar2 = lua_pcall(L,narg,-(uint)(clear == 0),iVar1);
  signal(2,(__sighandler_t)0x0);
  lua_remove(L,iVar1);
  if (iVar2 != 0) {
    lua_gc(L,2,0);
  }
  return iVar2;
}

Assistant:

static int docall(lua_State *L, int narg, int clear)
{
  int status;
  int base = lua_gettop(L) - narg;  /* function index */
  lua_pushcfunction(L, traceback);  /* push traceback function */
  lua_insert(L, base);  /* put it under chunk and args */
#if !LJ_TARGET_CONSOLE
  signal(SIGINT, laction);
#endif
  status = lua_pcall(L, narg, (clear ? 0 : LUA_MULTRET), base);
#if !LJ_TARGET_CONSOLE
  signal(SIGINT, SIG_DFL);
#endif
  lua_remove(L, base);  /* remove traceback function */
  /* force a complete garbage collection in case of errors */
  if (status != LUA_OK) lua_gc(L, LUA_GCCOLLECT, 0);
  return status;
}